

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

void __thiscall Container::kill_all(Container *this)

{
  int iVar1;
  int *piVar2;
  ContextManager *pCVar3;
  string local_68;
  __pid_t local_44;
  undefined1 local_40 [4];
  pid_t pid;
  int status;
  string local_30;
  Container *local_10;
  Container *this_local;
  
  local_10 = this;
  stop_timer();
  iVar1 = kill(-1,9);
  if ((iVar1 != 0) && (piVar2 = __errno_location(), *piVar2 != 3)) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Failed to kill all processes in box: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  set_standard_handler_restart(0xe,true);
  while( true ) {
    do {
      local_44 = wait(local_40);
    } while (-1 < local_44);
    piVar2 = __errno_location();
    if (*piVar2 == 10) break;
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_68,"kill_all() wait() failed: %m");
    (**pCVar3->_vptr_ContextManager)();
    std::__cxx11::string::~string((string *)&local_68);
  }
  set_standard_handler_restart(0xe,false);
  return;
}

Assistant:

void Container::kill_all() {
    stop_timer();
    if (kill(-1, SIGKILL) != 0 && errno != ESRCH) {
        die(format("Failed to kill all processes in box: %m"));
    }
    set_standard_handler_restart(SIGALRM, true);
    while (true) {
        int status;
        pid_t pid = wait(&status);
        if (pid < 0) {
            if (errno == ECHILD) {
                break;
            }
            die(format("kill_all() wait() failed: %m"));
        }
    }
    set_standard_handler_restart(SIGALRM, false);
}